

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void HuffmanTree_cleanup(HuffmanTree *tree)

{
  free(tree->codes);
  free(tree->lengths);
  free(tree->table_len);
  free(tree->table_value);
  return;
}

Assistant:

static void HuffmanTree_cleanup(HuffmanTree* tree) {
  lodepng_free(tree->codes);
  lodepng_free(tree->lengths);
  lodepng_free(tree->table_len);
  lodepng_free(tree->table_value);
}